

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_int>::clear(vector_downward<unsigned_int> *this)

{
  vector_downward<unsigned_int> *this_local;
  
  if (this->buf_ == (uint8_t *)0x0) {
    this->reserved_ = 0;
    this->cur_ = (uint8_t *)0x0;
  }
  else {
    this->cur_ = this->buf_ + this->reserved_;
  }
  this->size_ = 0;
  clear_scratch(this);
  return;
}

Assistant:

void clear() {
    if (buf_) {
      cur_ = buf_ + reserved_;
    } else {
      reserved_ = 0;
      cur_ = nullptr;
    }
    size_ = 0;
    clear_scratch();
  }